

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Access_ghost_element64(int g_a,void *ptr,int64_t *subscript,int64_t *ld)

{
  long lVar1;
  long lVar2;
  Integer _ld [7];
  Integer _subscript [7];
  long alStack_a8 [2];
  Integer aIStack_98 [7];
  long lStack_60;
  Integer local_58 [7];
  
  alStack_a8[1] = 0x116e53;
  lVar1 = pnga_ndim((long)g_a);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_60)[lVar2] = *subscript + 1;
      subscript = subscript + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (1 < lVar1) {
    do {
      alStack_a8[lVar1] = *ld + 1;
      lVar1 = lVar1 + -1;
      ld = ld + 1;
    } while (lVar1 != 1);
  }
  alStack_a8[1] = 0x116ea1;
  pnga_access_ghost_element_ptr((long)g_a,ptr,local_58,aIStack_98);
  return;
}

Assistant:

void NGA_Access_ghost_element64(int g_a, void *ptr, int64_t subscript[], int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _subscript[MAXDIM];
     Integer _ld[MAXDIM];

     COPYINDEX_C2F(subscript, _subscript, ndim);
     COPYINDEX_C2F(ld, _ld, ndim-1);
     wnga_access_ghost_element_ptr(a, ptr, _subscript, _ld);
}